

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O2

void rlScalef(float x,float y,float z)

{
  Matrix left;
  undefined1 auVar1 [56];
  Matrix *pMVar2;
  Matrix matScale;
  long local_c8;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  undefined8 uStack_18;
  
  pMVar2 = RLGL.State.currentMatrix;
  local_c8 = (ulong)(uint)y << 0x20;
  auVar1 = ZEXT4456(CONCAT440(z,ZEXT2440(CONCAT816(local_c8,ZEXT416((uint)x)))));
  left.m11 = 0.0;
  left.m15 = 1.0;
  left.m0 = (float)auVar1._0_4_;
  left.m4 = (float)auVar1._4_4_;
  left.m8 = (float)auVar1._8_4_;
  left.m12 = (float)auVar1._12_4_;
  left.m1 = (float)auVar1._16_4_;
  left.m5 = (float)auVar1._20_4_;
  left.m9 = (float)auVar1._24_4_;
  left.m13 = (float)auVar1._28_4_;
  left.m2 = (float)auVar1._32_4_;
  left.m6 = (float)auVar1._36_4_;
  left.m10 = (float)auVar1._40_4_;
  left.m14 = (float)auVar1._44_4_;
  left.m3 = (float)auVar1._48_4_;
  left.m7 = (float)auVar1._52_4_;
  rlMatrixMultiply(left,*RLGL.State.currentMatrix);
  pMVar2->m3 = (float)(undefined4)local_20;
  pMVar2->m7 = (float)local_20._4_4_;
  pMVar2->m11 = (float)(undefined4)uStack_18;
  pMVar2->m15 = (float)uStack_18._4_4_;
  pMVar2->m2 = (float)(undefined4)local_30;
  pMVar2->m6 = (float)local_30._4_4_;
  pMVar2->m10 = (float)(undefined4)uStack_28;
  pMVar2->m14 = (float)uStack_28._4_4_;
  pMVar2->m1 = (float)(undefined4)local_40;
  pMVar2->m5 = (float)local_40._4_4_;
  pMVar2->m9 = (float)(undefined4)uStack_38;
  pMVar2->m13 = (float)uStack_38._4_4_;
  pMVar2->m0 = (float)(undefined4)local_50;
  pMVar2->m4 = (float)local_50._4_4_;
  pMVar2->m8 = (float)(undefined4)uStack_48;
  pMVar2->m12 = (float)uStack_48._4_4_;
  return;
}

Assistant:

void rlScalef(float x, float y, float z)
{
    Matrix matScale = {
        x, 0.0f, 0.0f, 0.0f,
        0.0f, y, 0.0f, 0.0f,
        0.0f, 0.0f, z, 0.0f,
        0.0f, 0.0f, 0.0f, 1.0f
    };

    // NOTE: We transpose matrix with multiplication order
    *RLGL.State.currentMatrix = rlMatrixMultiply(matScale, *RLGL.State.currentMatrix);
}